

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrie2_builder.cpp
# Opt level: O0

void utrie2_freeze_63(UTrie2 *trie,UTrie2ValueBits valueBits,UErrorCode *pErrorCode)

{
  UNewTrie2 *buffer;
  undefined4 *puVar1;
  short sVar2;
  UBool UVar3;
  int iVar4;
  int iVar5;
  void *pvVar6;
  int32_t index2Offset;
  int32_t index1Length;
  UTrie2ValueBits frozenValueBits;
  UChar32 highStart;
  int32_t dataMove;
  int32_t allIndexesLength;
  int32_t length;
  int32_t i;
  uint16_t *dest16;
  uint32_t *p;
  UTrie2Header *header;
  UNewTrie2 *newTrie;
  UErrorCode *pErrorCode_local;
  UTrie2ValueBits valueBits_local;
  UTrie2 *trie_local;
  
  UVar3 = U_FAILURE(*pErrorCode);
  if (UVar3 == '\0') {
    if (((trie == (UTrie2 *)0x0) || ((int)valueBits < 0)) || (1 < (int)valueBits)) {
      *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else {
      buffer = trie->newTrie;
      if (buffer == (UNewTrie2 *)0x0) {
        if (valueBits != (trie->data16 == (uint16_t *)0x0)) {
          *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
        }
      }
      else {
        if (buffer->isCompacted == '\0') {
          compactTrie(trie,pErrorCode);
          UVar3 = U_FAILURE(*pErrorCode);
          if (UVar3 != '\0') {
            return;
          }
        }
        iVar5 = trie->highStart;
        if (iVar5 < 0x10001) {
          highStart = 0x840;
        }
        else {
          highStart = buffer->index2Length;
        }
        if (valueBits == UTRIE2_16_VALUE_BITS) {
          frozenValueBits = highStart;
        }
        else {
          frozenValueBits = UTRIE2_16_VALUE_BITS;
        }
        if (((highStart < 0x10000) && ((int)(frozenValueBits + buffer->dataNullOffset) < 0x10000))
           && (((int)(frozenValueBits + 0x880) < 0x10000 &&
               ((int)(frozenValueBits + buffer->dataLength) < 0x3fffd)))) {
          if (valueBits == UTRIE2_16_VALUE_BITS) {
            iVar4 = buffer->dataLength * 2;
          }
          else {
            iVar4 = buffer->dataLength * 4;
          }
          dataMove = iVar4 + highStart * 2 + 0x10;
          pvVar6 = uprv_malloc_63((long)dataMove);
          trie->memory = pvVar6;
          if (trie->memory == (void *)0x0) {
            *pErrorCode = U_MEMORY_ALLOCATION_ERROR;
          }
          else {
            trie->length = dataMove;
            trie->isMemoryOwned = '\x01';
            trie->indexLength = highStart;
            trie->dataLength = buffer->dataLength;
            if (iVar5 < 0x10001) {
              trie->index2NullOffset = 0xffff;
            }
            else {
              trie->index2NullOffset = (uint16_t)buffer->index2NullOffset;
            }
            sVar2 = (short)frozenValueBits;
            trie->dataNullOffset = sVar2 + (short)buffer->dataNullOffset;
            trie->highValueIndex = frozenValueBits + trie->dataLength + -4;
            puVar1 = (undefined4 *)trie->memory;
            *puVar1 = 0x54726932;
            *(short *)(puVar1 + 1) = (short)valueBits;
            *(short *)((long)puVar1 + 6) = (short)trie->indexLength;
            *(short *)(puVar1 + 2) = (short)(trie->dataLength >> 2);
            *(uint16_t *)((long)puVar1 + 10) = trie->index2NullOffset;
            *(uint16_t *)(puVar1 + 3) = trie->dataNullOffset;
            *(short *)((long)puVar1 + 0xe) = (short)(iVar5 >> 0xb);
            trie->index = (uint16_t *)(puVar1 + 4);
            _length = puVar1 + 4;
            dest16 = (uint16_t *)buffer->index2;
            for (allIndexesLength = 0x820; 0 < allIndexesLength;
                allIndexesLength = allIndexesLength + -1) {
              *(uint16_t *)_length = (uint16_t)(frozenValueBits + *(int *)dest16 >> 2);
              _length = (uint32_t *)((long)_length + 2);
              dest16 = dest16 + 2;
            }
            for (allIndexesLength = 0; allIndexesLength < 2; allIndexesLength = allIndexesLength + 1
                ) {
              *(uint16_t *)_length = sVar2 + 0x80;
              _length = (uint32_t *)((long)_length + 2);
            }
            for (; allIndexesLength < 0x20; allIndexesLength = allIndexesLength + 1) {
              *(short *)_length = sVar2 + (short)buffer->index2[allIndexesLength << 1];
              _length = (uint32_t *)((long)_length + 2);
            }
            if (0x10000 < iVar5) {
              allIndexesLength = iVar5 + -0x10000 >> 0xb;
              iVar5 = allIndexesLength + 0x840;
              dest16 = (uint16_t *)(buffer->index1 + 0x20);
              for (; 0 < allIndexesLength; allIndexesLength = allIndexesLength + -1) {
                *(uint16_t *)_length = (uint16_t)*(undefined4 *)dest16;
                _length = (uint32_t *)((long)_length + 2);
                dest16 = dest16 + 2;
              }
              dest16 = (uint16_t *)(buffer->index2 + iVar5);
              for (allIndexesLength = buffer->index2Length - iVar5; 0 < allIndexesLength;
                  allIndexesLength = allIndexesLength + -1) {
                *(uint16_t *)_length = (uint16_t)(frozenValueBits + *(int *)dest16 >> 2);
                _length = (uint32_t *)((long)_length + 2);
                dest16 = dest16 + 2;
              }
            }
            if (valueBits == UTRIE2_16_VALUE_BITS) {
              trie->data16 = (uint16_t *)_length;
              trie->data32 = (uint32_t *)0x0;
              dest16 = (uint16_t *)buffer->data;
              for (allIndexesLength = buffer->dataLength; 0 < allIndexesLength;
                  allIndexesLength = allIndexesLength + -1) {
                *(uint16_t *)_length = (uint16_t)*(undefined4 *)dest16;
                _length = (uint32_t *)((long)_length + 2);
                dest16 = dest16 + 2;
              }
            }
            else {
              if (valueBits != UTRIE2_32_VALUE_BITS) {
                *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
                return;
              }
              trie->data16 = (uint16_t *)0x0;
              trie->data32 = _length;
              memcpy(_length,buffer->data,(long)buffer->dataLength << 2);
            }
            uprv_free_63(buffer->data);
            uprv_free_63(buffer);
            trie->newTrie = (UNewTrie2 *)0x0;
          }
        }
        else {
          *pErrorCode = U_INDEX_OUTOFBOUNDS_ERROR;
        }
      }
    }
  }
  return;
}

Assistant:

U_CAPI void U_EXPORT2
utrie2_freeze(UTrie2 *trie, UTrie2ValueBits valueBits, UErrorCode *pErrorCode) {
    UNewTrie2 *newTrie;
    UTrie2Header *header;
    uint32_t *p;
    uint16_t *dest16;
    int32_t i, length;
    int32_t allIndexesLength;
    int32_t dataMove;  /* >0 if the data is moved to the end of the index array */
    UChar32 highStart;

    /* argument check */
    if(U_FAILURE(*pErrorCode)) {
        return;
    }
    if( trie==NULL ||
        valueBits<0 || UTRIE2_COUNT_VALUE_BITS<=valueBits
    ) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }
    newTrie=trie->newTrie;
    if(newTrie==NULL) {
        /* already frozen */
        UTrie2ValueBits frozenValueBits=
            trie->data16!=NULL ? UTRIE2_16_VALUE_BITS : UTRIE2_32_VALUE_BITS;
        if(valueBits!=frozenValueBits) {
            *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        }
        return;
    }

    /* compact if necessary */
    if(!newTrie->isCompacted) {
        compactTrie(trie, pErrorCode);
        if(U_FAILURE(*pErrorCode)) {
            return;
        }
    }
    highStart=trie->highStart;

    if(highStart<=0x10000) {
        allIndexesLength=UTRIE2_INDEX_1_OFFSET;
    } else {
        allIndexesLength=newTrie->index2Length;
    }
    if(valueBits==UTRIE2_16_VALUE_BITS) {
        dataMove=allIndexesLength;
    } else {
        dataMove=0;
    }

    /* are indexLength and dataLength within limits? */
    if( /* for unshifted indexLength */
        allIndexesLength>UTRIE2_MAX_INDEX_LENGTH ||
        /* for unshifted dataNullOffset */
        (dataMove+newTrie->dataNullOffset)>0xffff ||
        /* for unshifted 2-byte UTF-8 index-2 values */
        (dataMove+UNEWTRIE2_DATA_0800_OFFSET)>0xffff ||
        /* for shiftedDataLength */
        (dataMove+newTrie->dataLength)>UTRIE2_MAX_DATA_LENGTH
    ) {
        *pErrorCode=U_INDEX_OUTOFBOUNDS_ERROR;
        return;
    }

    /* calculate the total serialized length */
    length=sizeof(UTrie2Header)+allIndexesLength*2;
    if(valueBits==UTRIE2_16_VALUE_BITS) {
        length+=newTrie->dataLength*2;
    } else {
        length+=newTrie->dataLength*4;
    }

    trie->memory=uprv_malloc(length);
    if(trie->memory==NULL) {
        *pErrorCode=U_MEMORY_ALLOCATION_ERROR;
        return;
    }
    trie->length=length;
    trie->isMemoryOwned=TRUE;

    trie->indexLength=allIndexesLength;
    trie->dataLength=newTrie->dataLength;
    if(highStart<=0x10000) {
        trie->index2NullOffset=0xffff;
    } else {
        trie->index2NullOffset=static_cast<uint16_t>(UTRIE2_INDEX_2_OFFSET+newTrie->index2NullOffset);
    }
    trie->dataNullOffset=(uint16_t)(dataMove+newTrie->dataNullOffset);
    trie->highValueIndex=dataMove+trie->dataLength-UTRIE2_DATA_GRANULARITY;

    /* set the header fields */
    header=(UTrie2Header *)trie->memory;

    header->signature=UTRIE2_SIG; /* "Tri2" */
    header->options=(uint16_t)valueBits;

    header->indexLength=(uint16_t)trie->indexLength;
    header->shiftedDataLength=(uint16_t)(trie->dataLength>>UTRIE2_INDEX_SHIFT);
    header->index2NullOffset=trie->index2NullOffset;
    header->dataNullOffset=trie->dataNullOffset;
    header->shiftedHighStart=(uint16_t)(highStart>>UTRIE2_SHIFT_1);

    /* fill the index and data arrays */
    dest16=(uint16_t *)(header+1);
    trie->index=dest16;

    /* write the index-2 array values shifted right by UTRIE2_INDEX_SHIFT, after adding dataMove */
    p=(uint32_t *)newTrie->index2;
    for(i=UTRIE2_INDEX_2_BMP_LENGTH; i>0; --i) {
        *dest16++=(uint16_t)((dataMove + *p++)>>UTRIE2_INDEX_SHIFT);
    }

    /* write UTF-8 2-byte index-2 values, not right-shifted */
    for(i=0; i<(0xc2-0xc0); ++i) {                                  /* C0..C1 */
        *dest16++=(uint16_t)(dataMove+UTRIE2_BAD_UTF8_DATA_OFFSET);
    }
    for(; i<(0xe0-0xc0); ++i) {                                     /* C2..DF */
        *dest16++=(uint16_t)(dataMove+newTrie->index2[i<<(6-UTRIE2_SHIFT_2)]);
    }

    if(highStart>0x10000) {
        int32_t index1Length=(highStart-0x10000)>>UTRIE2_SHIFT_1;
        int32_t index2Offset=UTRIE2_INDEX_2_BMP_LENGTH+UTRIE2_UTF8_2B_INDEX_2_LENGTH+index1Length;

        /* write 16-bit index-1 values for supplementary code points */
        p=(uint32_t *)newTrie->index1+UTRIE2_OMITTED_BMP_INDEX_1_LENGTH;
        for(i=index1Length; i>0; --i) {
            *dest16++=(uint16_t)(UTRIE2_INDEX_2_OFFSET + *p++);
        }

        /*
         * write the index-2 array values for supplementary code points,
         * shifted right by UTRIE2_INDEX_SHIFT, after adding dataMove
         */
        p=(uint32_t *)newTrie->index2+index2Offset;
        for(i=newTrie->index2Length-index2Offset; i>0; --i) {
            *dest16++=(uint16_t)((dataMove + *p++)>>UTRIE2_INDEX_SHIFT);
        }
    }

    /* write the 16/32-bit data array */
    switch(valueBits) {
    case UTRIE2_16_VALUE_BITS:
        /* write 16-bit data values */
        trie->data16=dest16;
        trie->data32=NULL;
        p=newTrie->data;
        for(i=newTrie->dataLength; i>0; --i) {
            *dest16++=(uint16_t)*p++;
        }
        break;
    case UTRIE2_32_VALUE_BITS:
        /* write 32-bit data values */
        trie->data16=NULL;
        trie->data32=(uint32_t *)dest16;
        uprv_memcpy(dest16, newTrie->data, (size_t)newTrie->dataLength*4);
        break;
    default:
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }

#ifdef UTRIE2_DEBUG
    utrie2_printLengths(trie, "");
#endif

#ifdef UCPTRIE_DEBUG
    umutablecptrie_setName(newTrie->t3, trie->name);
    ucptrie_close(
        umutablecptrie_buildImmutable(
            newTrie->t3, UCPTRIE_TYPE_FAST, (UCPTrieValueWidth)valueBits, pErrorCode));
#endif
    /* Delete the UNewTrie2. */
    uprv_free(newTrie->data);
    uprv_free(newTrie);
    trie->newTrie=NULL;
}